

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

word * capnp::_::WireHelpers::copyMessage
                 (SegmentBuilder **segment,CapTableBuilder *capTable,WirePointer **dst,
                 WirePointer *src)

{
  ushort uVar1;
  uint uVar2;
  BuilderArena *pBVar3;
  Exception *pEVar4;
  byte bVar5;
  uint uVar6;
  SegmentBuilder *pSVar7;
  WirePointer *pWVar8;
  WirePointer *pWVar9;
  Exception *pEVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  AllocateResult AVar15;
  WirePointer *dstRef;
  SegmentBuilder *subSegment;
  Fault local_98;
  WirePointer *local_90;
  CapTableBuilder *local_88;
  WirePointer *local_80;
  SegmentBuilder **local_78;
  WirePointer *local_70;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> local_68;
  uint local_44;
  WirePointer *local_40;
  ulong local_38;
  
  uVar6 = (src->offsetAndKind).value;
  iVar13 = (int)uVar6 >> 2;
  local_88 = capTable;
  local_80 = (WirePointer *)dst;
  switch(uVar6 & 3) {
  case 0:
    uVar2 = (src->field_1).upper32Bits;
    if (uVar2 == 0 && uVar6 == 0) {
      pWVar9 = *dst;
      pWVar9->offsetAndKind = 0;
      pWVar9->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      return (word *)0x0;
    }
    uVar6 = (uVar2 & 0xffff) + (uVar2 >> 0x10);
    pWVar9 = *dst;
    if ((pWVar9->field_1).upper32Bits != 0 || (pWVar9->offsetAndKind).value != 0) {
      zeroObject(*segment,capTable,pWVar9);
    }
    if (uVar6 == 0) {
      local_90 = *dst;
      (local_90->offsetAndKind).value = 0xfffffffc;
    }
    else {
      pSVar7 = *segment;
      local_90 = (WirePointer *)pSVar7->pos;
      if ((long)(ulong)uVar6 <=
          (long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)local_90)) >> 3) {
        pSVar7->pos = (word *)(local_90 + uVar6);
        if (local_90 != (WirePointer *)0x0) {
          ((*dst)->offsetAndKind).value =
               ((uint)((ulong)((long)local_90 - (long)*dst) >> 1) & 0xfffffffc) - 4;
          goto LAB_0018a1c4;
        }
        pSVar7 = *segment;
      }
      pBVar3 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
      uVar6 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                        (uVar6 + 1,(anon_class_1_0_00000001 *)&local_68);
      AVar15 = BuilderArena::allocate(pBVar3,uVar6);
      local_90 = (WirePointer *)AVar15.words;
      pSVar7 = AVar15.segment;
      *segment = pSVar7;
      pWVar9 = *dst;
      (pWVar9->offsetAndKind).value =
           (int)AVar15.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
      pWVar9->field_1 =
           (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar7->super_SegmentReader).id.value;
      *dst = local_90;
      (local_90->offsetAndKind).value = 0;
      local_90 = local_90 + 1;
    }
LAB_0018a1c4:
    pWVar9 = local_90;
    pEVar4 = (Exception *)*segment;
    uVar1 = *(ushort *)&src->field_1;
    uVar6 = (uint)uVar1;
    uVar12 = (ulong)(src->field_1).structRef.ptrCount.value;
    if (uVar1 == 0) {
      uVar6 = 0;
    }
    else {
      memcpy(local_90,src + (long)iVar13 + 1,(ulong)((uint)uVar1 * 8));
    }
    pWVar8 = (WirePointer *)((long)&src[(long)iVar13 + 1].offsetAndKind.value + (ulong)(uVar6 << 3))
    ;
    pEVar10 = (Exception *)((long)&(pWVar9->offsetAndKind).value + (ulong)(uVar6 << 3));
    while (bVar14 = uVar12 != 0, uVar12 = uVar12 - 1, bVar14) {
      local_98.exception = pEVar10;
      local_68._0_8_ = pEVar4;
      copyMessage((SegmentBuilder **)&local_68,local_88,(WirePointer **)&local_98,pWVar8);
      pEVar10 = (Exception *)&(pEVar10->ownFile).content.size_;
      pWVar8 = pWVar8 + 1;
    }
    (*(WirePointer **)local_80)->field_1 = src->field_1;
    return (word *)local_90;
  case 2:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
              ((Fault *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x404,FAILED,(char *)0x0,"\"Unchecked messages cannot contain far pointers.\"",
               (char (*) [48])"Unchecked messages cannot contain far pointers.");
    kj::_::Debug::Fault::fatal((Fault *)&local_68);
  case 3:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
              ((Fault *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x401,FAILED,(char *)0x0,
               "\"Unchecked messages cannot contain OTHER pointers (e.g. capabilities).\"",
               (char (*) [70])
               "Unchecked messages cannot contain OTHER pointers (e.g. capabilities).");
    kj::_::Debug::Fault::fatal((Fault *)&local_68);
  }
  uVar6 = (src->field_1).upper32Bits;
  bVar5 = (byte)uVar6 & 7;
  if (5 < bVar5) {
    local_78 = segment;
    if ((uVar6 & 7) != 6) {
      uVar6 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::copyMessage(capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,capnp::_::WirePointer*&,capnp::_::WirePointer_const*)::_lambda()_1_>
                        ((uVar6 >> 3) + 1,(anon_class_1_0_00000001 *)&local_98);
      pWVar9 = *dst;
      if ((pWVar9->field_1).upper32Bits != 0 || (pWVar9->offsetAndKind).value != 0) {
        zeroObject(*segment,local_88,pWVar9);
      }
      local_40 = src + (long)iVar13 + 1;
      pSVar7 = *segment;
      local_90 = (WirePointer *)pSVar7->pos;
      if ((long)(ulong)uVar6 <=
          (long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)local_90)) >> 3) {
        pSVar7->pos = (word *)(local_90 + uVar6);
        if (local_90 != (WirePointer *)0x0) {
          pWVar9 = *dst;
          (pWVar9->offsetAndKind).value =
               ((uint)((ulong)((long)local_90 - (long)pWVar9) >> 1) & 0xfffffffc) - 3;
          goto LAB_0018a3ae;
        }
        pSVar7 = *segment;
      }
      pBVar3 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
      uVar6 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                        (uVar6 + 1,(anon_class_1_0_00000001 *)&local_68);
      AVar15 = BuilderArena::allocate(pBVar3,uVar6);
      pWVar9 = (WirePointer *)AVar15.words;
      pSVar7 = AVar15.segment;
      *segment = pSVar7;
      pWVar8 = *dst;
      (pWVar8->offsetAndKind).value =
           (int)AVar15.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
      pWVar8->field_1 =
           (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar7->super_SegmentReader).id.value;
      *dst = pWVar9;
      (pWVar9->offsetAndKind).value = 1;
      local_90 = pWVar9 + 1;
LAB_0018a3ae:
      (pWVar9->field_1).upper32Bits = (src->field_1).upper32Bits | 7;
      *local_90 = *local_40;
      uVar6 = (local_40->offsetAndKind).value;
      local_68.result = (uVar6 & 3) == 0;
      local_68._0_8_ = (ulong)uVar6 & 0xffffffff00000003;
      local_68.op.content.ptr = " == ";
      local_68.op.content.size_ = 5;
      if (local_68.result) {
        local_80 = local_90 + 1;
        local_70 = local_40 + 1;
        local_44 = uVar6 >> 2 & 0x1fffffff;
        for (local_38 = 0; (uint)local_38 != local_44; local_38 = (ulong)((int)local_38 + 1)) {
          pEVar4 = (Exception *)*segment;
          uVar1 = *(ushort *)&local_40->field_1;
          uVar6 = (uint)uVar1;
          uVar12 = (ulong)(local_40->field_1).structRef.ptrCount.value;
          if (uVar1 == 0) {
            uVar6 = 0;
          }
          else {
            memcpy(local_80,local_70,(ulong)((uint)uVar1 * 8));
          }
          pWVar9 = (WirePointer *)((long)&(local_70->offsetAndKind).value + (ulong)(uVar6 << 3));
          pEVar10 = (Exception *)((long)&(local_80->offsetAndKind).value + (ulong)(uVar6 << 3));
          while (bVar14 = uVar12 != 0, uVar12 = uVar12 - 1, bVar14) {
            local_98.exception = pEVar10;
            local_68._0_8_ = pEVar4;
            copyMessage((SegmentBuilder **)&local_68,local_88,(WirePointer **)&local_98,pWVar9);
            pEVar10 = (Exception *)&(pEVar10->ownFile).content.size_;
            pWVar9 = pWVar9 + 1;
          }
          uVar12 = (ulong)(((uint)(local_40->field_1).structRef.ptrCount.value +
                           (uint)(local_40->field_1).structRef.dataSize.value) * 8);
          local_70 = (WirePointer *)((long)&(local_70->offsetAndKind).value + uVar12);
          local_80 = (WirePointer *)((long)&(local_80->offsetAndKind).value + uVar12);
          segment = local_78;
        }
        return (word *)local_90;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[48]>
                (&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x3f3,FAILED,"srcTag->kind() == WirePointer::STRUCT",
                 "_kjCondition,\"INLINE_COMPOSITE of lists is not yet supported.\"",&local_68,
                 (char (*) [48])"INLINE_COMPOSITE of lists is not yet supported.");
      kj::_::Debug::Fault::fatal(&local_98);
    }
    uVar6 = uVar6 >> 3;
    pWVar9 = *dst;
    if ((pWVar9->field_1).upper32Bits != 0 || (pWVar9->offsetAndKind).value != 0) {
      zeroObject(*segment,capTable,pWVar9);
    }
    pSVar7 = *segment;
    pWVar9 = (WirePointer *)pSVar7->pos;
    if ((long)(ulong)uVar6 <=
        (long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
              ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)pWVar9)) >> 3) {
      pSVar7->pos = (word *)(pWVar9 + uVar6);
      if (pWVar9 != (WirePointer *)0x0) {
        ((*dst)->offsetAndKind).value =
             ((uint)((ulong)((long)pWVar9 - (long)*dst) >> 1) & 0xfffffffc) - 3;
        goto LAB_0018a2e4;
      }
      pSVar7 = *local_78;
    }
    pBVar3 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
    uVar6 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                      (uVar6 + 1,(anon_class_1_0_00000001 *)&local_68);
    AVar15 = BuilderArena::allocate(pBVar3,uVar6);
    pWVar9 = (WirePointer *)AVar15.words;
    pSVar7 = AVar15.segment;
    *local_78 = pSVar7;
    pWVar8 = *dst;
    (pWVar8->offsetAndKind).value =
         (int)AVar15.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
    pWVar8->field_1 =
         (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar7->super_SegmentReader).id.value;
    *dst = pWVar9;
    (pWVar9->offsetAndKind).value = 1;
    pWVar9 = pWVar9 + 1;
LAB_0018a2e4:
    uVar6 = (src->field_1).upper32Bits;
    local_70 = src;
    for (uVar12 = 0; (uVar6 & 0xfffffff8) != uVar12; uVar12 = uVar12 + 8) {
      local_68._0_8_ = *local_78;
      local_98.exception = (Exception *)((long)&(pWVar9->offsetAndKind).value + uVar12);
      copyMessage((SegmentBuilder **)&local_68,local_88,(WirePointer **)&local_98,
                  (WirePointer *)((long)&src[(long)iVar13 + 1].offsetAndKind.value + uVar12));
    }
    ((*(WirePointer **)local_80)->field_1).upper32Bits =
         (local_70->field_1).upper32Bits & 0xfffffff8 | 6;
    return (word *)pWVar9;
  }
  uVar12 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)bVar5 * 4) * (ulong)(uVar6 >> 3) + 0x3f
           >> 6;
  pWVar9 = *dst;
  if ((pWVar9->field_1).upper32Bits != 0 || (pWVar9->offsetAndKind).value != 0) {
    zeroObject(*segment,capTable,pWVar9);
  }
  pSVar7 = *segment;
  pWVar9 = (WirePointer *)pSVar7->pos;
  iVar11 = (int)uVar12;
  uVar12 = uVar12 & 0xffffffff;
  if ((long)uVar12 <=
      (long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
            ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)pWVar9)) >> 3) {
    pSVar7->pos = (word *)(pWVar9 + uVar12);
    if (pWVar9 != (WirePointer *)0x0) {
      pWVar8 = *dst;
      (pWVar8->offsetAndKind).value =
           ((uint)((ulong)((long)pWVar9 - (long)pWVar8) >> 1) & 0xfffffffc) - 3;
      goto LAB_0018a0d6;
    }
    pSVar7 = *segment;
  }
  pBVar3 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
  uVar6 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                    (iVar11 + 1,(anon_class_1_0_00000001 *)&local_68);
  AVar15 = BuilderArena::allocate(pBVar3,uVar6);
  pWVar8 = (WirePointer *)AVar15.words;
  pSVar7 = AVar15.segment;
  *segment = pSVar7;
  pWVar9 = *dst;
  (pWVar9->offsetAndKind).value =
       (int)AVar15.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
  pWVar9->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar7->super_SegmentReader).id.value;
  *dst = pWVar8;
  (pWVar8->offsetAndKind).value = 1;
  pWVar9 = pWVar8 + 1;
LAB_0018a0d6:
  if (iVar11 != 0) {
    memcpy(pWVar9,src + (long)iVar13 + 1,(ulong)(uint)(iVar11 << 3));
    pWVar8 = *dst;
  }
  pWVar8->field_1 = src->field_1;
  return (word *)pWVar9;
}

Assistant:

static word* copyMessage(
      SegmentBuilder*& segment, CapTableBuilder* capTable,
      WirePointer*& dst, const WirePointer* src) {
    // Not always-inline because it's recursive.

    switch (src->kind()) {
      case WirePointer::STRUCT: {
        if (src->isNull()) {
          zeroMemory(dst);
          return nullptr;
        } else {
          const word* srcPtr = src->target(nullptr);
          word* dstPtr = allocate(
              dst, segment, capTable, src->structRef.wordSize(), WirePointer::STRUCT, nullptr);

          copyStruct(segment, capTable, dstPtr, srcPtr, src->structRef.dataSize.get(),
                     src->structRef.ptrCount.get());

          dst->structRef.set(src->structRef.dataSize.get(), src->structRef.ptrCount.get());
          return dstPtr;
        }
      }
      case WirePointer::LIST: {
        switch (src->listRef.elementSize()) {
          case ElementSize::VOID:
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            auto wordCount = roundBitsUpToWords(
                upgradeBound<uint64_t>(src->listRef.elementCount()) *
                dataBitsPerElement(src->listRef.elementSize()));
            const word* srcPtr = src->target(nullptr);
            word* dstPtr = allocate(dst, segment, capTable, wordCount, WirePointer::LIST, nullptr);
            copyMemory(dstPtr, srcPtr, wordCount);

            dst->listRef.set(src->listRef.elementSize(), src->listRef.elementCount());
            return dstPtr;
          }

          case ElementSize::POINTER: {
            const WirePointer* srcRefs = reinterpret_cast<const WirePointer*>(src->target(nullptr));
            WirePointer* dstRefs = reinterpret_cast<WirePointer*>(
                allocate(dst, segment, capTable, src->listRef.elementCount() *
                    (ONE * POINTERS / ELEMENTS) * WORDS_PER_POINTER,
                    WirePointer::LIST, nullptr));

            for (auto i: kj::zeroTo(src->listRef.elementCount() * (ONE * POINTERS / ELEMENTS))) {
              SegmentBuilder* subSegment = segment;
              WirePointer* dstRef = dstRefs + i;
              copyMessage(subSegment, capTable, dstRef, srcRefs + i);
            }

            dst->listRef.set(ElementSize::POINTER, src->listRef.elementCount());
            return reinterpret_cast<word*>(dstRefs);
          }

          case ElementSize::INLINE_COMPOSITE: {
            const word* srcPtr = src->target(nullptr);
            word* dstPtr = allocate(dst, segment, capTable,
                assertMaxBits<SEGMENT_WORD_COUNT_BITS>(
                    src->listRef.inlineCompositeWordCount() + POINTER_SIZE_IN_WORDS,
                    []() { KJ_FAIL_ASSERT("list too big to fit in a segment"); }),
                WirePointer::LIST, nullptr);

            dst->listRef.setInlineComposite(src->listRef.inlineCompositeWordCount());

            const WirePointer* srcTag = reinterpret_cast<const WirePointer*>(srcPtr);
            copyMemory(reinterpret_cast<WirePointer*>(dstPtr), srcTag);

            const word* srcElement = srcPtr + POINTER_SIZE_IN_WORDS;
            word* dstElement = dstPtr + POINTER_SIZE_IN_WORDS;

            KJ_ASSERT(srcTag->kind() == WirePointer::STRUCT,
                "INLINE_COMPOSITE of lists is not yet supported.");

            for (auto i KJ_UNUSED: kj::zeroTo(srcTag->inlineCompositeListElementCount())) {
              copyStruct(segment, capTable, dstElement, srcElement,
                  srcTag->structRef.dataSize.get(), srcTag->structRef.ptrCount.get());
              srcElement += srcTag->structRef.wordSize();
              dstElement += srcTag->structRef.wordSize();
            }
            return dstPtr;
          }
        }
        break;
      }
      case WirePointer::OTHER:
        KJ_FAIL_REQUIRE("Unchecked messages cannot contain OTHER pointers (e.g. capabilities).");
        break;
      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unchecked messages cannot contain far pointers.");
        break;
    }

    return nullptr;
  }